

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase252::run(TestCase252 *this)

{
  undefined1 auVar1 [16];
  uint uVar2;
  DebugExpression<bool> _kjCondition_1;
  undefined1 auStack_bf [15];
  Schema local_b0;
  Schema local_a8;
  DebugComparison<int,_unsigned_int> _kjCondition;
  DebugComparison<const_char_(&)[14],_capnp::Text::Reader> _kjCondition_5;
  
  auStack_bf._7_8_ = __kjCondition_1;
  __kjCondition_1 = (RawBrandedSchema *)(NULL_SCHEMA + 0x48);
  Schema::getProto((Reader *)&_kjCondition_5,(Schema *)&_kjCondition_1);
  _kjCondition.right = 0;
  if (0x6f < (uint)_kjCondition_5.op.content.size_) {
    _kjCondition.right = (uint)*(ushort *)(_kjCondition_5.right.super_StringPtr.content.size_ + 0xc)
    ;
  }
  _kjCondition.left = 0xff;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 0xff;
  if ((_kjCondition.right != 0xff) && (kj::_::Debug::minSeverity < 3)) {
    local_b0.raw._0_4_ = 0xff;
    __kjCondition_1 = (RawBrandedSchema *)(NULL_SCHEMA + 0x48);
    Schema::getProto((Reader *)&_kjCondition_5,(Schema *)&_kjCondition_1);
    uVar2 = 0;
    if (0x6f < (uint)_kjCondition_5.op.content.size_) {
      uVar2 = (uint)*(ushort *)(_kjCondition_5.right.super_StringPtr.content.size_ + 0xc);
    }
    local_a8.raw._0_4_ = uVar2;
    kj::_::Debug::log<char_const(&)[63],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0xfd,ERROR,
               "\"failed: expected \" \"(0xff) == ((uint)Schema().getProto().which())\", _kjCondition, 0xff, (uint)Schema().getProto().which()"
               ,(char (*) [63])"failed: expected (0xff) == ((uint)Schema().getProto().which())",
               &_kjCondition,(int *)&local_b0,(uint *)&local_a8);
  }
  _kjCondition.left = 0x669d00;
  _kjCondition.right = 0;
  Schema::getProto((Reader *)&_kjCondition_5,(Schema *)&_kjCondition);
  if ((uint)_kjCondition_5.op.content.size_ < 0x70) {
    _kjCondition_1.value = false;
joined_r0x001a1e9d:
    if (kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::log<char_const(&)[54],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xfe,ERROR,
                 "\"failed: expected \" \"StructSchema().getProto().isStruct()\", _kjCondition",
                 (char (*) [54])"failed: expected StructSchema().getProto().isStruct()",
                 &_kjCondition_1);
    }
  }
  else {
    _kjCondition_1.value = *(short *)(_kjCondition_5.right.super_StringPtr.content.size_ + 0xc) == 1
    ;
    if (!_kjCondition_1.value) goto joined_r0x001a1e9d;
  }
  _kjCondition.left = 0x669d78;
  _kjCondition.right = 0;
  Schema::getProto((Reader *)&_kjCondition_5,(Schema *)&_kjCondition);
  if ((uint)_kjCondition_5.op.content.size_ < 0x70) {
    _kjCondition_1.value = false;
joined_r0x001a1f0e:
    if (kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::log<char_const(&)[50],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xff,ERROR,
                 "\"failed: expected \" \"EnumSchema().getProto().isEnum()\", _kjCondition",
                 (char (*) [50])"failed: expected EnumSchema().getProto().isEnum()",&_kjCondition_1)
      ;
    }
  }
  else {
    _kjCondition_1.value = *(short *)(_kjCondition_5.right.super_StringPtr.content.size_ + 0xc) == 2
    ;
    if (!_kjCondition_1.value) goto joined_r0x001a1f0e;
  }
  _kjCondition.left = 0x669df0;
  _kjCondition.right = 0;
  Schema::getProto((Reader *)&_kjCondition_5,(Schema *)&_kjCondition);
  if ((uint)_kjCondition_5.op.content.size_ < 0x70) {
    _kjCondition_1.value = false;
joined_r0x001a1f87:
    if (kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::log<char_const(&)[60],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x100,ERROR,
                 "\"failed: expected \" \"InterfaceSchema().getProto().isInterface()\", _kjCondition"
                 ,(char (*) [60])"failed: expected InterfaceSchema().getProto().isInterface()",
                 &_kjCondition_1);
    }
  }
  else {
    _kjCondition_1.value = *(short *)(_kjCondition_5.right.super_StringPtr.content.size_ + 0xc) == 3
    ;
    if (!_kjCondition_1.value) goto joined_r0x001a1f87;
  }
  _kjCondition.left = 0x669e68;
  _kjCondition.right = 0;
  Schema::getProto((Reader *)&_kjCondition_5,(Schema *)&_kjCondition);
  if ((uint)_kjCondition_5.op.content.size_ < 0x70) {
    auVar1[0xf] = 0;
    auVar1._0_15_ = auStack_bf;
    __kjCondition_1 = (ArrayPtr<const_char>)(auVar1 << 8);
  }
  else {
    _kjCondition_1.value = *(short *)(_kjCondition_5.right.super_StringPtr.content.size_ + 0xc) == 4
    ;
    if (_kjCondition_1.value) goto LAB_001a2029;
  }
  if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x101,ERROR,
               "\"failed: expected \" \"ConstSchema().getProto().isConst()\", _kjCondition",
               (char (*) [52])"failed: expected ConstSchema().getProto().isConst()",&_kjCondition_1)
    ;
  }
LAB_001a2029:
  local_b0.raw = (RawBrandedSchema *)0x4320c8;
  local_a8.raw = (RawBrandedSchema *)(NULL_SCHEMA + 0x48);
  Schema::getProto((Reader *)&_kjCondition,&local_a8);
  __kjCondition_1 =
       (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName((Reader *)&_kjCondition);
  kj::_::DebugExpression<char_const(&)[14]>::operator==
            (&_kjCondition_5,(DebugExpression<char_const(&)[14]> *)&local_b0,
             (Reader *)&_kjCondition_1);
  if ((_kjCondition_5.result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_b0.raw = (RawBrandedSchema *)(NULL_SCHEMA + 0x48);
    Schema::getProto((Reader *)&_kjCondition,&local_b0);
    __kjCondition_1 =
         (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName((Reader *)&_kjCondition);
    kj::_::Debug::
    log<char_const(&)[77],kj::_::DebugComparison<char_const(&)[14],capnp::Text::Reader>&,char_const(&)[14],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x103,ERROR,
               "\"failed: expected \" \"(\\\"(null schema)\\\") == (Schema().getProto().getDisplayName())\", _kjCondition, \"(null schema)\", Schema().getProto().getDisplayName()"
               ,(char (*) [77])
                "failed: expected (\"(null schema)\") == (Schema().getProto().getDisplayName())",
               &_kjCondition_5,(char (*) [14])"(null schema)",(Reader *)&_kjCondition_1);
  }
  local_b0.raw = (RawBrandedSchema *)0x4321bc;
  local_a8.raw = (RawBrandedSchema *)(NULL_STRUCT_SCHEMA + 0x48);
  Schema::getProto((Reader *)&_kjCondition,&local_a8);
  __kjCondition_1 =
       (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName((Reader *)&_kjCondition);
  kj::_::DebugExpression<char_const(&)[21]>::operator==
            ((DebugComparison<const_char_(&)[21],_capnp::Text::Reader> *)&_kjCondition_5,
             (DebugExpression<char_const(&)[21]> *)&local_b0,(Reader *)&_kjCondition_1);
  if ((_kjCondition_5.result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_b0.raw = (RawBrandedSchema *)(NULL_STRUCT_SCHEMA + 0x48);
    Schema::getProto((Reader *)&_kjCondition,&local_b0);
    __kjCondition_1 =
         (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName((Reader *)&_kjCondition);
    kj::_::Debug::
    log<char_const(&)[90],kj::_::DebugComparison<char_const(&)[21],capnp::Text::Reader>&,char_const(&)[21],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x104,ERROR,
               "\"failed: expected \" \"(\\\"(null struct schema)\\\") == (StructSchema().getProto().getDisplayName())\", _kjCondition, \"(null struct schema)\", StructSchema().getProto().getDisplayName()"
               ,(char (*) [90])
                "failed: expected (\"(null struct schema)\") == (StructSchema().getProto().getDisplayName())"
               ,(DebugComparison<const_char_(&)[21],_capnp::Text::Reader> *)&_kjCondition_5,
               (char (*) [21])"(null struct schema)",(Reader *)&_kjCondition_1);
  }
  local_b0.raw = (RawBrandedSchema *)0x4322de;
  local_a8.raw = (RawBrandedSchema *)(NULL_ENUM_SCHEMA + 0x48);
  Schema::getProto((Reader *)&_kjCondition,&local_a8);
  __kjCondition_1 =
       (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName((Reader *)&_kjCondition);
  kj::_::DebugExpression<char_const(&)[19]>::operator==
            ((DebugComparison<const_char_(&)[19],_capnp::Text::Reader> *)&_kjCondition_5,
             (DebugExpression<char_const(&)[19]> *)&local_b0,(Reader *)&_kjCondition_1);
  if ((_kjCondition_5.result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_b0.raw = (RawBrandedSchema *)(NULL_ENUM_SCHEMA + 0x48);
    Schema::getProto((Reader *)&_kjCondition,&local_b0);
    __kjCondition_1 =
         (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName((Reader *)&_kjCondition);
    kj::_::Debug::
    log<char_const(&)[86],kj::_::DebugComparison<char_const(&)[19],capnp::Text::Reader>&,char_const(&)[19],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x105,ERROR,
               "\"failed: expected \" \"(\\\"(null enum schema)\\\") == (EnumSchema().getProto().getDisplayName())\", _kjCondition, \"(null enum schema)\", EnumSchema().getProto().getDisplayName()"
               ,(char (*) [86])
                "failed: expected (\"(null enum schema)\") == (EnumSchema().getProto().getDisplayName())"
               ,(DebugComparison<const_char_(&)[19],_capnp::Text::Reader> *)&_kjCondition_5,
               (char (*) [19])"(null enum schema)",(Reader *)&_kjCondition_1);
  }
  local_b0.raw = (RawBrandedSchema *)0x4323f2;
  local_a8.raw = (RawBrandedSchema *)(NULL_INTERFACE_SCHEMA + 0x48);
  Schema::getProto((Reader *)&_kjCondition,&local_a8);
  __kjCondition_1 =
       (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName((Reader *)&_kjCondition);
  kj::_::DebugExpression<char_const(&)[24]>::operator==
            ((DebugComparison<const_char_(&)[24],_capnp::Text::Reader> *)&_kjCondition_5,
             (DebugExpression<char_const(&)[24]> *)&local_b0,(Reader *)&_kjCondition_1);
  if ((_kjCondition_5.result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_b0.raw = (RawBrandedSchema *)(NULL_INTERFACE_SCHEMA + 0x48);
    Schema::getProto((Reader *)&_kjCondition,&local_b0);
    __kjCondition_1 =
         (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName((Reader *)&_kjCondition);
    kj::_::Debug::
    log<char_const(&)[96],kj::_::DebugComparison<char_const(&)[24],capnp::Text::Reader>&,char_const(&)[24],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x106,ERROR,
               "\"failed: expected \" \"(\\\"(null interface schema)\\\") == (InterfaceSchema().getProto().getDisplayName())\", _kjCondition, \"(null interface schema)\", InterfaceSchema().getProto().getDisplayName()"
               ,(char (*) [96])
                "failed: expected (\"(null interface schema)\") == (InterfaceSchema().getProto().getDisplayName())"
               ,(DebugComparison<const_char_(&)[24],_capnp::Text::Reader> *)&_kjCondition_5,
               (char (*) [24])"(null interface schema)",(Reader *)&_kjCondition_1);
  }
  local_b0.raw = (RawBrandedSchema *)0x432529;
  local_a8.raw = (RawBrandedSchema *)(NULL_CONST_SCHEMA + 0x48);
  Schema::getProto((Reader *)&_kjCondition,&local_a8);
  __kjCondition_1 =
       (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName((Reader *)&_kjCondition);
  kj::_::DebugExpression<char_const(&)[20]>::operator==
            ((DebugComparison<const_char_(&)[20],_capnp::Text::Reader> *)&_kjCondition_5,
             (DebugExpression<char_const(&)[20]> *)&local_b0,(Reader *)&_kjCondition_1);
  if ((_kjCondition_5.result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_b0.raw = (RawBrandedSchema *)(NULL_CONST_SCHEMA + 0x48);
    Schema::getProto((Reader *)&_kjCondition,&local_b0);
    __kjCondition_1 =
         (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName((Reader *)&_kjCondition);
    kj::_::Debug::
    log<char_const(&)[88],kj::_::DebugComparison<char_const(&)[20],capnp::Text::Reader>&,char_const(&)[20],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x107,ERROR,
               "\"failed: expected \" \"(\\\"(null const schema)\\\") == (ConstSchema().getProto().getDisplayName())\", _kjCondition, \"(null const schema)\", ConstSchema().getProto().getDisplayName()"
               ,(char (*) [88])
                "failed: expected (\"(null const schema)\") == (ConstSchema().getProto().getDisplayName())"
               ,(DebugComparison<const_char_(&)[20],_capnp::Text::Reader> *)&_kjCondition_5,
               (char (*) [20])"(null const schema)",(Reader *)&_kjCondition_1);
  }
  __kjCondition_1 = (RawBrandedSchema *)(NULL_INTERFACE_SCHEMA + 0x48);
  Schema::getProto((Reader *)&_kjCondition_5,(Schema *)&_kjCondition_1);
  if ((uint)_kjCondition_5.op.content.size_ < 0x40) {
    _kjCondition._0_8_ = 0;
  }
  else {
    _kjCondition._0_8_ = *(undefined8 *)_kjCondition_5.right.super_StringPtr.content.size_;
  }
  _kjCondition.op.content.ptr = (char *)0x3;
  _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_3d166;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  if ((_kjCondition._0_8_ != 3) && (kj::_::Debug::minSeverity < 3)) {
    local_b0.raw = (RawBrandedSchema *)(NULL_INTERFACE_SCHEMA + 0x48);
    Schema::getProto((Reader *)&_kjCondition_5,&local_b0);
    if ((uint)_kjCondition_5.op.content.size_ < 0x40) {
      __kjCondition_1 = (RawBrandedSchema *)0x0;
    }
    else {
      __kjCondition_1 = *(RawBrandedSchema **)_kjCondition_5.right.super_StringPtr.content.size_;
    }
    local_a8.raw = (RawBrandedSchema *)0x3;
    kj::_::Debug::
    log<char_const(&)[82],kj::_::DebugComparison<unsigned_long,unsigned_long>&,unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x10a,ERROR,
               "\"failed: expected \" \"(InterfaceSchema().getProto().getId()) == (typeId<Capability>())\", _kjCondition, InterfaceSchema().getProto().getId(), typeId<Capability>()"
               ,(char (*) [82])
                "failed: expected (InterfaceSchema().getProto().getId()) == (typeId<Capability>())",
               (DebugComparison<unsigned_long,_unsigned_long> *)&_kjCondition,
               (unsigned_long *)&_kjCondition_1,(unsigned_long *)&local_a8);
  }
  return;
}

Assistant:

TEST(Schema, FieldLookupOutOfOrder) {
  // Tests that name lookup works correctly when the fields are defined out-of-order in the schema
  // file.
  auto schema = Schema::from<test::TestOutOfOrder>().asStruct();

  EXPECT_EQ("qux", schema.getFields()[0].getProto().getName());
  EXPECT_EQ("grault", schema.getFields()[1].getProto().getName());
  EXPECT_EQ("bar", schema.getFields()[2].getProto().getName());
  EXPECT_EQ("foo", schema.getFields()[3].getProto().getName());
  EXPECT_EQ("corge", schema.getFields()[4].getProto().getName());
  EXPECT_EQ("waldo", schema.getFields()[5].getProto().getName());
  EXPECT_EQ("quux", schema.getFields()[6].getProto().getName());
  EXPECT_EQ("garply", schema.getFields()[7].getProto().getName());
  EXPECT_EQ("baz", schema.getFields()[8].getProto().getName());

  EXPECT_EQ(3, schema.getFieldByName("foo").getProto().getOrdinal().getExplicit());
  EXPECT_EQ(2, schema.getFieldByName("bar").getProto().getOrdinal().getExplicit());
  EXPECT_EQ(8, schema.getFieldByName("baz").getProto().getOrdinal().getExplicit());
  EXPECT_EQ(0, schema.getFieldByName("qux").getProto().getOrdinal().getExplicit());
  EXPECT_EQ(6, schema.getFieldByName("quux").getProto().getOrdinal().getExplicit());
  EXPECT_EQ(4, schema.getFieldByName("corge").getProto().getOrdinal().getExplicit());
  EXPECT_EQ(1, schema.getFieldByName("grault").getProto().getOrdinal().getExplicit());
  EXPECT_EQ(7, schema.getFieldByName("garply").getProto().getOrdinal().getExplicit());
  EXPECT_EQ(5, schema.getFieldByName("waldo").getProto().getOrdinal().getExplicit());
}